

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

string_t * cfgfile::format_t<long,cfgfile::string_trait_t>::to_string_abi_cxx11_(long *value)

{
  string_t *in_RDI;
  long in_stack_00000038;
  
  std::__cxx11::to_string(in_stack_00000038);
  return in_RDI;
}

Assistant:

static string_trait_t::string_t to_string( const long & value )
	{
		return std::to_string( value );
	}